

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O0

UDate __thiscall
icu_63::RuleBasedTimeZone::getTransitionTime
          (RuleBasedTimeZone *this,Transition *transition,UBool local,int32_t NonExistingTimeOpt,
          int32_t DuplicatedTimeOpt)

{
  int32_t iVar1;
  int32_t dstBefore;
  int32_t rawAfter;
  int32_t dstAfter;
  double local_30;
  UDate time;
  int32_t DuplicatedTimeOpt_local;
  int32_t NonExistingTimeOpt_local;
  UBool local_local;
  Transition *transition_local;
  RuleBasedTimeZone *this_local;
  
  local_30 = transition->time;
  if (local != '\0') {
    iVar1 = TimeZoneRule::getRawOffset(transition->from);
    dstBefore = TimeZoneRule::getDSTSavings(transition->from);
    rawAfter = TimeZoneRule::getRawOffset(transition->to);
    dstAfter = TimeZoneRule::getDSTSavings(transition->to);
    iVar1 = getLocalDelta(this,iVar1,dstBefore,rawAfter,dstAfter,NonExistingTimeOpt,
                          DuplicatedTimeOpt);
    local_30 = (double)iVar1 + local_30;
  }
  return local_30;
}

Assistant:

UDate
RuleBasedTimeZone::getTransitionTime(Transition* transition, UBool local,
                                     int32_t NonExistingTimeOpt, int32_t DuplicatedTimeOpt) const {
    UDate time = transition->time;
    if (local) {
        time += getLocalDelta(transition->from->getRawOffset(), transition->from->getDSTSavings(),
                              transition->to->getRawOffset(), transition->to->getDSTSavings(),
                              NonExistingTimeOpt, DuplicatedTimeOpt);
    }
    return time;
}